

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Initialize(BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *this,int capacity)

{
  int iVar1;
  code *pcVar2;
  Type TVar3;
  int *piVar4;
  bool bVar5;
  undefined4 *puVar6;
  DictionaryStats *pDVar7;
  uint bucketCount;
  uint bucketCount_00;
  Type local_40;
  int *newBuckets;
  EntryType *newEntries;
  
  bucketCount_00 = 4;
  bucketCount = 4;
  if (4 < capacity) {
    bucketCount = capacity;
  }
  if ((8 < capacity) &&
     (bucketCount_00 = bucketCount + 1 >> 1, (bucketCount_00 - 1 & bucketCount_00) != 0)) {
    iVar1 = 0x1f;
    if (bucketCount_00 != 0) {
      for (; bucketCount_00 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    bucketCount_00 = 1 << (-((byte)iVar1 ^ 0x1f) & 0x1f);
  }
  local_40.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  Allocate(this,&local_40.ptr,(EntryType **)&newBuckets,bucketCount_00,bucketCount);
  TVar3.ptr = local_40.ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->buckets).ptr = TVar3.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  piVar4 = newBuckets;
  Memory::Recycler::WBSetBit((char *)&this->entries);
  (this->entries).ptr =
       (SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FrameDisplay>,_Memory::WriteBarrierPtr<Js::FrameDisplay>_>
        *)piVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
  this->bucketCount = bucketCount_00;
  this->size = bucketCount;
  this->modFunctionIndex = 0x4b;
  if (this->freeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x38c,"(this->freeCount == 0)","this->freeCount == 0");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    bucketCount = this->size;
  }
  pDVar7 = DictionaryStats::Create
                     ("PN6JsUtil14BaseDictionaryIPN2Js12FrameDisplayES3_N6Memory8RecyclerE20DictionarySizePolicyI14PowerOf2PolicyLj2ELj2ELj1ELj4EE15DefaultComparerNS_17SimpleHashedEntryENS_12NoResizeLockEEE"
                      ,bucketCount);
  this->stats = pDVar7;
  return;
}

Assistant:

void Initialize(int capacity)
        {
            // minimum capacity is 4
            int initSize = max(capacity, 4);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint initBucketCount = SizePolicy::GetBucketSize(initSize, &modIndex);
            AssertMsg(initBucketCount > 0, "Size returned by policy should be greater than 0");

            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            Allocate(&newBuckets, &newEntries, initBucketCount, initSize);

            // Allocation can throw - assign only after allocation has succeeded.
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->bucketCount = initBucketCount;
            this->size = initSize;
            this->modFunctionIndex = modIndex;
            Assert(this->freeCount == 0);
#if PROFILE_DICTIONARY
            stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
        }